

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Ptr * wabt::interp::Instance::Instantiate
                (Ptr *__return_storage_ptr__,Store *store,Ref module,RefVec *imports,Ptr *out_trap)

{
  pointer pIVar1;
  pointer pIVar2;
  pointer pFVar3;
  void *pvVar4;
  pointer pTVar5;
  pointer pMVar6;
  pointer pGVar7;
  pointer pEVar8;
  pointer pEVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer pEVar11;
  ElemDesc *pEVar12;
  pointer pDVar13;
  DataDesc *pDVar14;
  pointer pSVar15;
  undefined8 uVar16;
  int iVar17;
  Result RVar18;
  Ref *pRVar19;
  pointer pRVar20;
  ulong uVar21;
  GlobalDesc *desc_3;
  pointer pGVar22;
  pointer pEVar23;
  pointer src;
  pointer src_00;
  uint uVar24;
  FuncDesc *desc;
  pointer pFVar25;
  pointer pTVar26;
  pointer pMVar27;
  Ptr *out_trap_00;
  iterator iVar28;
  Instance *pIVar29;
  ulong uVar30;
  vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *this;
  ElemDesc *desc_5;
  long lVar31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  long lVar33;
  pointer pSVar34;
  ExportDesc *desc_4;
  pointer pEVar35;
  ulong uVar36;
  bool bVar37;
  Ptr extern_;
  Ptr table;
  Ptr inst;
  Ptr mod;
  Ref extern_ref;
  anon_union_16_6_113bff37_for_Value_0 local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Any_data local_1e8;
  Index local_1d8;
  RefPtr<wabt::interp::Instance> local_1c8;
  Ptr *local_1b0;
  RefPtr<wabt::interp::Module> local_1a8;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> local_188;
  Ptr *local_170;
  RefPtr<wabt::interp::Trap> local_168;
  long local_150;
  RefVec *local_148;
  GlobalType local_140;
  EventType local_128;
  anon_union_16_6_113bff37_for_Value_0 local_100;
  Index local_f0;
  MemoryType local_e8;
  TableType local_c0;
  FuncDesc local_98;
  Ref local_38;
  
  local_1b0 = __return_storage_ptr__;
  local_38.index = module.index;
  RefPtr<wabt::interp::Module>::RefPtr(&local_1a8,store,module);
  Store::Alloc<wabt::interp::Instance,wabt::interp::Store&,wabt::interp::Ref&>
            (&local_1c8,store,store,&local_38);
  pIVar1 = ((local_1a8.obj_)->desc_).imports.
           super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pIVar2 = ((local_1a8.obj_)->desc_).imports.
           super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar30 = ((long)pIVar2 - (long)pIVar1 >> 3) * -0x71c71c71c71c71c7;
  local_148 = imports;
  if ((ulong)((long)(imports->
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(imports->
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) < uVar30) {
    local_208.i64_ = (u64)&local_1f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"not enough imports!","");
    local_168.root_index_ = 0;
    local_168.obj_ = (Trap *)0x0;
    local_168.store_ = (Store *)0x0;
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              ((RefPtr<wabt::interp::Trap> *)&local_1e8,store,store,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208.v128_
               ,(vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_168);
    out_trap->obj_ = (Trap *)local_1e8._M_unused._0_8_;
    out_trap->store_ = (Store *)local_1e8._8_8_;
    out_trap->root_index_ = local_1d8;
    local_1d8 = 0;
    local_1e8._M_unused._M_object = (Memory *)0x0;
    local_1e8._8_8_ = (Store *)0x0;
    if (local_168.obj_ != (Trap *)0x0) {
      operator_delete(local_168.obj_);
    }
LAB_0019f7bd:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.i64_ != &local_1f8) {
      operator_delete((void *)local_208.i64_);
    }
    local_1b0->obj_ = (Instance *)0x0;
    local_1b0->store_ = (Store *)0x0;
    local_1b0->root_index_ = 0;
  }
  else {
    if (pIVar2 != pIVar1) {
      local_150 = uVar30 + (uVar30 == 0);
      lVar33 = 0;
      lVar31 = 0;
      do {
        pIVar1 = ((local_1a8.obj_)->desc_).imports.
                 super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_188.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)(local_148->
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
                      _M_impl.super__Vector_impl_data._M_start[lVar31].index;
        if (local_188.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          StringPrintf_abi_cxx11_
                    ((string *)&local_208.v128_,"invalid import \"%s.%s\"",
                     *(undefined8 *)((long)&(pIVar1->type).module._M_dataplus + lVar33),
                     *(undefined8 *)((long)&(pIVar1->type).name._M_dataplus + lVar33));
          local_168.root_index_ = 0;
          local_168.obj_ = (Trap *)0x0;
          local_168.store_ = (Store *)0x0;
          Store::
          Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                    ((RefPtr<wabt::interp::Trap> *)&local_1e8,store,store,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_208.v128_,
                     (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_168
                    );
          out_trap->obj_ = (Trap *)local_1e8._M_unused._0_8_;
          out_trap->store_ = (Store *)local_1e8._8_8_;
          out_trap->root_index_ = local_1d8;
          local_1d8 = 0;
          local_1e8._M_unused._M_object = (Memory *)0x0;
          local_1e8._8_8_ = (Store *)0x0;
          if (local_168.obj_ != (Trap *)0x0) {
            operator_delete(local_168.obj_);
          }
          goto LAB_0019f7bd;
        }
        RefPtr<wabt::interp::Extern>::RefPtr
                  ((RefPtr<wabt::interp::Extern> *)&local_208.v128_,store,
                   (Ref)local_188.
                        super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        iVar17 = (**(code **)(*(size_type *)local_208.i64_ + 0x18))
                           (local_208.i64_,store,(long)&(pIVar1->type).module._M_dataplus + lVar33,
                            out_trap);
        if (iVar17 == 1) {
          local_1b0->obj_ = (Instance *)0x0;
          local_1b0->store_ = (Store *)0x0;
          local_1b0->root_index_ = 0;
        }
        else {
          iVar28._M_current =
               ((local_1c8.obj_)->imports_).
               super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar28._M_current ==
              ((local_1c8.obj_)->imports_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
            _M_realloc_insert<wabt::interp::Ref_const&>
                      ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                       &(local_1c8.obj_)->imports_,iVar28,(Ref *)&local_188);
          }
          else {
            (iVar28._M_current)->index =
                 (size_t)local_188.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1c8.obj_)->imports_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar28._M_current + 1;
          }
          switch(*(undefined4 *)(*(long *)((long)&(pIVar1->type).type._M_t + lVar33) + 8)) {
          case 0:
            iVar28._M_current =
                 ((local_1c8.obj_)->funcs_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar28._M_current ==
                ((local_1c8.obj_)->funcs_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1c8.obj_)->funcs_;
LAB_0019f9d9:
              std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
              _M_realloc_insert<wabt::interp::Ref_const&>(this,iVar28,(Ref *)&local_188);
            }
            else {
              (iVar28._M_current)->index =
                   (size_t)local_188.
                           super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              ((local_1c8.obj_)->funcs_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar28._M_current + 1;
            }
            break;
          case 1:
            iVar28._M_current =
                 ((local_1c8.obj_)->tables_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar28._M_current ==
                ((local_1c8.obj_)->tables_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1c8.obj_)->tables_;
              goto LAB_0019f9d9;
            }
            (iVar28._M_current)->index =
                 (size_t)local_188.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1c8.obj_)->tables_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar28._M_current + 1;
            break;
          case 2:
            iVar28._M_current =
                 ((local_1c8.obj_)->memories_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar28._M_current ==
                ((local_1c8.obj_)->memories_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1c8.obj_)->memories_;
              goto LAB_0019f9d9;
            }
            (iVar28._M_current)->index =
                 (size_t)local_188.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1c8.obj_)->memories_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar28._M_current + 1;
            break;
          case 3:
            iVar28._M_current =
                 ((local_1c8.obj_)->globals_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar28._M_current ==
                ((local_1c8.obj_)->globals_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1c8.obj_)->globals_;
              goto LAB_0019f9d9;
            }
            (iVar28._M_current)->index =
                 (size_t)local_188.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1c8.obj_)->globals_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar28._M_current + 1;
            break;
          case 4:
            iVar28._M_current =
                 ((local_1c8.obj_)->events_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar28._M_current ==
                ((local_1c8.obj_)->events_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1c8.obj_)->events_;
              goto LAB_0019f9d9;
            }
            (iVar28._M_current)->index =
                 (size_t)local_188.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1c8.obj_)->events_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar28._M_current + 1;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208.i64_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          FreeList<wabt::interp::Ref>::Delete
                    ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                     local_1f8._M_allocated_capacity);
          local_208.i64_ = 0;
          local_208._8_8_ = 0;
          local_1f8._M_allocated_capacity = 0;
        }
        if (iVar17 == 1) goto LAB_001a069f;
        lVar31 = lVar31 + 1;
        lVar33 = lVar33 + 0x48;
      } while (local_150 != lVar31);
    }
    pFVar25 = ((local_1a8.obj_)->desc_).funcs.
              super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pFVar3 = ((local_1a8.obj_)->desc_).funcs.
             super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_170 = out_trap;
    if (pFVar25 != pFVar3) {
      do {
        pIVar29 = local_1c8.obj_;
        pRVar19 = (Ref *)&Ref::Null;
        if (local_1c8.store_ != (Store *)0x0) {
          pRVar19 = FreeList<wabt::interp::Ref>::Get
                              (&(local_1c8.store_)->roots_,local_1c8.root_index_);
        }
        pvVar4 = (void *)pRVar19->index;
        local_98.type.super_ExternType.kind = (pFVar25->type).super_ExternType.kind;
        local_98.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00210440;
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                  (&local_98.type.params,&(pFVar25->type).params);
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                  (&local_98.type.results,&(pFVar25->type).results);
        std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
                  (&local_98.locals,&pFVar25->locals);
        local_98.code_offset = pFVar25->code_offset;
        local_1e8._M_unused._M_object = pvVar4;
        Store::
        Alloc<wabt::interp::DefinedFunc,wabt::interp::Store&,wabt::interp::Ref&,wabt::interp::FuncDesc&>
                  ((RefPtr<wabt::interp::DefinedFunc> *)&local_208.v128_,store,store,
                   (Ref *)&local_1e8,&local_98);
        pRVar19 = (Ref *)&Ref::Null;
        if (local_208._8_8_ != 0) {
          pRVar19 = FreeList<wabt::interp::Ref>::Get
                              ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                               local_1f8._M_allocated_capacity);
        }
        local_1e8._M_unused._0_8_ = (undefined8)pRVar19->index;
        iVar28._M_current =
             (pIVar29->funcs_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar28._M_current ==
            (pIVar29->funcs_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
          _M_realloc_insert<wabt::interp::Ref>(&pIVar29->funcs_,iVar28,(Ref *)&local_1e8);
        }
        else {
          (iVar28._M_current)->index = (size_t)local_1e8._M_unused._0_8_;
          (pIVar29->funcs_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar28._M_current + 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208.i64_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          FreeList<wabt::interp::Ref>::Delete
                    ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                     local_1f8._M_allocated_capacity);
          local_208.i64_ = 0;
          local_208._8_8_ = 0;
          local_1f8._M_allocated_capacity = 0;
        }
        if (local_98.locals.
            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.locals.
                          super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        local_98.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00210440;
        if (local_98.type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.type.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_98.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.type.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        pFVar25 = pFVar25 + 1;
      } while (pFVar25 != pFVar3);
    }
    pTVar5 = ((local_1a8.obj_)->desc_).tables.
             super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pIVar29 = local_1c8.obj_;
    for (pTVar26 = ((local_1a8.obj_)->desc_).tables.
                   super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pTVar26 != pTVar5;
        pTVar26 = pTVar26 + 1) {
      local_c0.super_ExternType.kind = (pTVar26->type).super_ExternType.kind;
      local_c0.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_00210480;
      local_c0.limits._12_7_ =
           SUB87((ulong)*(undefined8 *)((long)&(pTVar26->type).limits.max + 3) >> 8,0);
      local_c0._12_8_ = *(undefined8 *)&(pTVar26->type).super_ExternType.field_0xc;
      uVar16 = *(undefined8 *)((long)&(pTVar26->type).limits.initial + 4);
      local_c0.limits._4_7_ = SUB87(uVar16,0);
      local_c0.limits.max._3_1_ = (undefined1)((ulong)uVar16 >> 0x38);
      local_1c8.obj_ = pIVar29;
      Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
                ((RefPtr<wabt::interp::Table> *)&local_208.v128_,store,store,&local_c0);
      pRVar19 = (Ref *)&Ref::Null;
      if (local_208._8_8_ != 0) {
        pRVar19 = FreeList<wabt::interp::Ref>::Get
                            ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                             local_1f8._M_allocated_capacity);
      }
      local_1e8._M_unused._0_8_ = (undefined8)pRVar19->index;
      iVar28._M_current =
           (pIVar29->tables_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar28._M_current ==
          (pIVar29->tables_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
        _M_realloc_insert<wabt::interp::Ref>(&pIVar29->tables_,iVar28,(Ref *)&local_1e8);
      }
      else {
        (iVar28._M_current)->index = (size_t)local_1e8._M_unused._0_8_;
        (pIVar29->tables_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar28._M_current + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208.i64_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        FreeList<wabt::interp::Ref>::Delete
                  ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                   local_1f8._M_allocated_capacity);
        local_208.i64_ = 0;
        local_208._8_8_ = 0;
        local_1f8._M_allocated_capacity = 0;
      }
      pIVar29 = local_1c8.obj_;
    }
    pMVar6 = ((local_1a8.obj_)->desc_).memories.
             super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pMVar27 = ((local_1a8.obj_)->desc_).memories.
                   super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; local_1c8.obj_ = pIVar29,
        pMVar27 != pMVar6; pMVar27 = pMVar27 + 1) {
      local_e8.super_ExternType.kind = (pMVar27->type).super_ExternType.kind;
      local_e8.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002104c0;
      local_e8.limits.has_max = (pMVar27->type).limits.has_max;
      local_e8.limits.is_shared = (pMVar27->type).limits.is_shared;
      local_e8.limits.is_64 = (pMVar27->type).limits.is_64;
      local_e8.limits._19_5_ = *(undefined5 *)&(pMVar27->type).limits.field_0x13;
      local_e8.limits.initial = (pMVar27->type).limits.initial;
      local_e8.limits.max = (pMVar27->type).limits.max;
      Store::Alloc<wabt::interp::Memory,wabt::interp::Store&,wabt::interp::MemoryType&>
                ((RefPtr<wabt::interp::Memory> *)&local_208.v128_,store,store,&local_e8);
      pRVar19 = (Ref *)&Ref::Null;
      if (local_208._8_8_ != 0) {
        pRVar19 = FreeList<wabt::interp::Ref>::Get
                            ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                             local_1f8._M_allocated_capacity);
      }
      local_1e8._M_unused._0_8_ = (undefined8)pRVar19->index;
      iVar28._M_current =
           (pIVar29->memories_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar28._M_current ==
          (pIVar29->memories_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
        _M_realloc_insert<wabt::interp::Ref>(&pIVar29->memories_,iVar28,(Ref *)&local_1e8);
      }
      else {
        (iVar28._M_current)->index = (size_t)local_1e8._M_unused._0_8_;
        (pIVar29->memories_).
        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar28._M_current + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208.i64_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        FreeList<wabt::interp::Ref>::Delete
                  ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                   local_1f8._M_allocated_capacity);
        local_208.i64_ = 0;
        local_208._8_8_ = 0;
        local_1f8._M_allocated_capacity = 0;
      }
      pIVar29 = local_1c8.obj_;
    }
    pGVar22 = ((local_1a8.obj_)->desc_).globals.
              super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pGVar7 = ((local_1a8.obj_)->desc_).globals.
             super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pGVar22 != pGVar7) {
      do {
        pIVar29 = local_1c8.obj_;
        local_140.super_ExternType.kind = (pGVar22->type).super_ExternType.kind;
        local_140.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_00210500;
        local_140._12_8_ = *(undefined8 *)&(pGVar22->type).super_ExternType.field_0xc;
        ResolveInitExpr((Value *)&local_100.v128_,local_1c8.obj_,store,pGVar22->init);
        local_1f8._M_allocated_capacity = local_f0;
        local_208.i64_ = local_100.i64_;
        local_208._8_8_ = local_100._8_8_;
        Store::
        Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
                  ((RefPtr<wabt::interp::Global> *)&local_1e8,store,store,&local_140,
                   (Value *)&local_208.v128_);
        pRVar19 = (Ref *)&Ref::Null;
        if ((Store *)local_1e8._8_8_ != (Store *)0x0) {
          pRVar19 = FreeList<wabt::interp::Ref>::Get
                              ((FreeList<wabt::interp::Ref> *)(local_1e8._8_8_ + 0x68),local_1d8);
        }
        local_208.i64_ = pRVar19->index;
        iVar28._M_current =
             (pIVar29->globals_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar28._M_current ==
            (pIVar29->globals_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
          _M_realloc_insert<wabt::interp::Ref>(&pIVar29->globals_,iVar28,&local_208.ref_);
        }
        else {
          (iVar28._M_current)->index = local_208.i64_;
          (pIVar29->globals_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar28._M_current + 1;
        }
        if ((Memory *)local_1e8._M_unused._0_8_ != (Memory *)0x0) {
          FreeList<wabt::interp::Ref>::Delete
                    ((FreeList<wabt::interp::Ref> *)(local_1e8._8_8_ + 0x68),local_1d8);
          local_1e8._M_unused._M_object = (Memory *)0x0;
          local_1e8._8_8_ = (Store *)0x0;
          local_1d8 = 0;
        }
        pGVar22 = pGVar22 + 1;
      } while (pGVar22 != pGVar7);
    }
    pEVar8 = ((local_1a8.obj_)->desc_).events.
             super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pIVar29 = local_1c8.obj_;
    for (pEVar23 = ((local_1a8.obj_)->desc_).events.
                   super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; local_1c8.obj_ = pIVar29,
        pEVar23 != pEVar8; pEVar23 = (pointer)((long)pEVar23 + 0x28)) {
      local_128.super_ExternType.kind =
           *(ExternKind *)&((EventType *)((long)pEVar23 + 8))->super_ExternType;
      local_128.super_ExternType._vptr_ExternType = (_func_int **)&PTR__EventType_00210540;
      local_128.super_ExternType._12_4_ =
           *(undefined4 *)&((EventType *)((long)pEVar23 + 0xc))->super_ExternType;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                (&local_128.signature,
                 (vector<wabt::Type,_std::allocator<wabt::Type>_> *)((long)pEVar23 + 0x10));
      Store::Alloc<wabt::interp::Event,wabt::interp::Store&,wabt::interp::EventType&>
                ((RefPtr<wabt::interp::Event> *)&local_208.v128_,store,store,&local_128);
      pRVar19 = (Ref *)&Ref::Null;
      if (local_208._8_8_ != 0) {
        pRVar19 = FreeList<wabt::interp::Ref>::Get
                            ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                             local_1f8._M_allocated_capacity);
      }
      local_1e8._M_unused._0_8_ = (undefined8)pRVar19->index;
      iVar28._M_current =
           *(Ref **)&((RefVec *)((long)pIVar29 + 200))->
                     super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>;
      if (iVar28._M_current ==
          *(Ref **)&((RefVec *)((long)pIVar29 + 0xd0))->
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>) {
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
        _M_realloc_insert<wabt::interp::Ref>
                  ((RefVec *)((long)pIVar29 + 0xc0),iVar28,(Ref *)&local_1e8);
      }
      else {
        (iVar28._M_current)->index = (size_t)local_1e8._M_unused._0_8_;
        *(Ref **)&((RefVec *)((long)pIVar29 + 200))->
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> =
             iVar28._M_current + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208.i64_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        FreeList<wabt::interp::Ref>::Delete
                  ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                   local_1f8._M_allocated_capacity);
        local_208.i64_ = 0;
        local_208._8_8_ = 0;
        local_1f8._M_allocated_capacity = 0;
      }
      local_128.super_ExternType._vptr_ExternType = (_func_int **)&PTR__EventType_00210540;
      if (local_128.signature.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.signature.
                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pIVar29 = local_1c8.obj_;
    }
    pEVar35 = *(pointer *)&((ModuleDesc *)((long)local_1a8.obj_ + 0xe8))->func_types;
    pEVar9 = *(pointer *)&((ModuleDesc *)((long)local_1a8.obj_ + 0xf0))->func_types;
    if (pEVar35 != pEVar9) {
      do {
        switch(((pEVar35->type).type._M_t.
                super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                ._M_t.
                super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->kind) {
        case First:
          uVar30 = (ulong)pEVar35->index;
          pRVar20 = ((local_1c8.obj_)->funcs_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case Table:
          uVar30 = (ulong)pEVar35->index;
          pRVar20 = ((local_1c8.obj_)->tables_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case Memory:
          uVar30 = (ulong)pEVar35->index;
          pRVar20 = ((local_1c8.obj_)->memories_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case Global:
          uVar30 = (ulong)pEVar35->index;
          pRVar20 = ((local_1c8.obj_)->globals_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case Event:
          uVar30 = (ulong)pEVar35->index;
          pRVar20 = ((local_1c8.obj_)->events_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        default:
          goto switchD_001a00ba_default;
        }
        local_208.i64_ = pRVar20[uVar30].index;
switchD_001a00ba_default:
        iVar28._M_current =
             ((local_1c8.obj_)->exports_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar28._M_current ==
            ((local_1c8.obj_)->exports_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
          _M_realloc_insert<wabt::interp::Ref_const&>
                    ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1c8.obj_)->exports_,iVar28,&local_208.ref_);
        }
        else {
          (iVar28._M_current)->index = local_208.i64_;
          ((local_1c8.obj_)->exports_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar28._M_current + 1;
        }
        pEVar35 = pEVar35 + 1;
      } while (pEVar35 != pEVar9);
    }
    paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((local_1a8.obj_)->desc_).elems.
                 super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((local_1a8.obj_)->desc_).elems.
                 super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    if (paVar32 != paVar10) {
      do {
        local_208.i64_ = (u64)paVar32;
        std::vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>>::
        emplace_back<wabt::interp::ElemDesc_const*,wabt::interp::RefPtr<wabt::interp::Instance>&>
                  ((vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>> *)
                   &(local_1c8.obj_)->elems_,(ElemDesc **)&local_208.i64_,&local_1c8);
        paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar32->_M_local_buf + 0x40);
      } while (paVar32 != paVar10);
    }
    paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((local_1a8.obj_)->desc_).datas.
                 super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((local_1a8.obj_)->desc_).datas.
                 super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    if (paVar32 != paVar10) {
      do {
        local_208.i64_ = (u64)paVar32;
        std::vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>>::
        emplace_back<wabt::interp::DataDesc_const*>
                  ((vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>> *)
                   &(local_1c8.obj_)->datas_,(DataDesc **)&local_208.i64_);
        paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar32 + 0x38);
      } while (paVar32 != paVar10);
    }
    uVar24 = (uint)(store->features_).bulk_memory_enabled_;
    do {
      pEVar11 = ((local_1c8.obj_)->elems_).
                super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (src = ((local_1c8.obj_)->elems_).
                 super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                 ._M_impl.super__Vector_impl_data._M_start; src != pEVar11; src = src + 1) {
        pEVar12 = src->desc_;
        if (pEVar12->mode == Declared) {
          pRVar20 = (src->elements_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((src->elements_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish != pRVar20) {
            (src->elements_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = pRVar20;
          }
        }
        else if (pEVar12->mode == Active) {
          RefPtr<wabt::interp::Table>::RefPtr
                    ((RefPtr<wabt::interp::Table> *)&local_1e8,store,
                     (Ref)((local_1c8.obj_)->tables_).
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start[pEVar12->table_index].index);
          pIVar29 = local_1c8.obj_;
          ResolveInitExpr((Value *)&local_208.v128_,local_1c8.obj_,store,pEVar12->offset);
          if (1 < local_1f8._M_allocated_capacity._0_4_ + 1) goto LAB_001a0804;
          uVar36 = local_208.i64_ & 0xffffffff;
          uVar30 = (ulong)((long)(src->elements_).
                                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(src->elements_).
                                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3;
          if (uVar24 == 0) {
            uVar21 = (long)*(pointer *)(local_1e8._M_unused._M_function_pointer + 0x70) -
                     (long)(((_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)
                            &((Buffer *)(local_1e8._M_unused._M_function_pointer + 0x68))->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)->
                           _M_impl).super__Vector_impl_data._M_start >> 3;
            uVar30 = uVar30 & 0xffffffff;
            RVar18.enum_ = (Enum)(uVar21 - uVar30 < uVar36 || uVar21 < uVar30);
          }
          else {
            RVar18 = Table::Init((Table *)local_1e8._M_unused._0_8_,(Store *)pIVar29,local_208.i32_,
                                 src,0,(u32)uVar30);
            pRVar20 = (src->elements_).
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if ((src->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_finish != pRVar20) {
              (src->elements_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish = pRVar20;
            }
          }
          if (RVar18.enum_ == Error) {
            StringPrintf_abi_cxx11_
                      ((string *)&local_208.v128_,
                       "out of bounds table access: elem segment is out of bounds: [%u, %lu) >= max value %u"
                       ,uVar36,((ulong)((long)(src->elements_).
                                              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(src->elements_).
                                             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3 &
                               0xffffffff) + uVar36,
                       (ulong)((long)*(pointer *)(local_1e8._M_unused._M_function_pointer + 0x70) -
                              (long)(((_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                       *)&((Buffer *)
                                          (local_1e8._M_unused._M_function_pointer + 0x68))->
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )->_M_impl).super__Vector_impl_data._M_start) >> 3);
            goto LAB_001a05e3;
          }
          if ((Memory *)local_1e8._M_unused._0_8_ != (Memory *)0x0) {
            FreeList<wabt::interp::Ref>::Delete
                      ((FreeList<wabt::interp::Ref> *)(local_1e8._8_8_ + 0x68),local_1d8);
            local_1e8._M_unused._M_object = (Memory *)0x0;
            local_1e8._8_8_ = (Store *)0x0;
            local_1d8 = 0;
          }
        }
      }
      pDVar13 = ((local_1c8.obj_)->datas_).
                super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (src_00 = ((local_1c8.obj_)->datas_).
                    super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                    ._M_impl.super__Vector_impl_data._M_start; src_00 != pDVar13;
          src_00 = src_00 + 1) {
        pDVar14 = src_00->desc_;
        if (pDVar14->mode == Declared) {
          src_00->size_ = 0;
        }
        else if (pDVar14->mode == Active) {
          RefPtr<wabt::interp::Memory>::RefPtr
                    ((RefPtr<wabt::interp::Memory> *)&local_1e8,store,
                     (Ref)((local_1c8.obj_)->memories_).
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start[pDVar14->memory_index].index);
          ResolveInitExpr((Value *)&local_208.v128_,local_1c8.obj_,store,pDVar14->offset);
          if (1 < local_1f8._M_allocated_capacity._0_4_ + 1) {
LAB_001a0804:
            __assert_fail("t == type || type == ValueType::Any",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp.h"
                          ,0x22d,"void wabt::interp::Value::CheckType(ValueType) const");
          }
          uVar36 = local_208.i64_ & 0xffffffff;
          uVar30 = src_00->size_;
          if (uVar24 == 0) {
            uVar21 = (long)*(pointer *)(local_1e8._M_unused._M_function_pointer + 0x70) -
                     (long)(((Buffer *)(local_1e8._M_unused._M_function_pointer + 0x68))->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start;
            bVar37 = uVar21 < uVar30 + uVar36 || (uVar21 < uVar30 || uVar21 < uVar36);
          }
          else {
            RVar18 = Memory::Init((Memory *)local_1e8._M_unused._0_8_,uVar36,src_00,0,uVar30);
            src_00->size_ = 0;
            bVar37 = RVar18.enum_ == Error;
          }
          if (bVar37) {
            StringPrintf_abi_cxx11_
                      ((string *)&local_208.v128_,
                       "out of bounds memory access: data segment is out of bounds: [%u, %lu) >= max value %lu"
                       ,uVar36,uVar36 + src_00->size_,
                       (long)*(pointer *)(local_1e8._M_unused._M_function_pointer + 0x70) -
                       (long)(((_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                *)&((Buffer *)(local_1e8._M_unused._M_function_pointer + 0x68))->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              )->_M_impl).super__Vector_impl_data._M_start);
LAB_001a05e3:
            local_188.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_188.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_188.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            Store::
            Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                      (&local_168,store,store,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_208.v128_,&local_188);
            local_170->obj_ = local_168.obj_;
            local_170->store_ = local_168.store_;
            local_170->root_index_ = local_168.root_index_;
            local_168.root_index_ = 0;
            local_168.obj_ = (Trap *)0x0;
            local_168.store_ = (Store *)0x0;
            if (local_188.
                super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_188.
                              super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208.i64_ != &local_1f8) {
              operator_delete((void *)local_208.i64_);
            }
            local_1b0->obj_ = (Instance *)0x0;
            local_1b0->store_ = (Store *)0x0;
            local_1b0->root_index_ = 0;
            if ((Memory *)local_1e8._M_unused._0_8_ != (Memory *)0x0) {
              FreeList<wabt::interp::Ref>::Delete
                        ((FreeList<wabt::interp::Ref> *)(local_1e8._8_8_ + 0x68),local_1d8);
              local_1e8._M_unused._M_object = (Memory *)0x0;
              local_1e8._8_8_ = (Store *)0x0;
              local_1d8 = 0;
            }
            goto LAB_001a069f;
          }
          if ((Memory *)local_1e8._M_unused._0_8_ != (Memory *)0x0) {
            FreeList<wabt::interp::Ref>::Delete
                      ((FreeList<wabt::interp::Ref> *)(local_1e8._8_8_ + 0x68),local_1d8);
            local_1e8._M_unused._M_object = (Memory *)0x0;
            local_1e8._8_8_ = (Store *)0x0;
            local_1d8 = 0;
          }
        }
      }
      bVar37 = uVar24 == 0;
      uVar24 = uVar24 + 1;
    } while (bVar37);
    pSVar34 = ((local_1a8.obj_)->desc_).starts.
              super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar15 = ((local_1a8.obj_)->desc_).starts.
              super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (pSVar34 != pSVar15) {
      out_trap_00 = local_170;
      do {
        RefPtr<wabt::interp::Func>::RefPtr
                  ((RefPtr<wabt::interp::Func> *)&local_208.v128_,store,
                   (Ref)((local_1c8.obj_)->funcs_).
                        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                        _M_impl.super__Vector_impl_data._M_start[pSVar34->func_index].index);
        local_1d8 = 0;
        local_1e8._M_unused._M_object = (Memory *)0x0;
        local_1e8._8_8_ = (Store *)0x0;
        local_168.root_index_ = 0;
        local_168.obj_ = (Trap *)0x0;
        local_168.store_ = (Store *)0x0;
        RVar18 = Func::Call((Func *)local_208.i64_,store,(Values *)&local_168,(Values *)&local_1e8,
                            out_trap_00,(Stream *)0x0);
        if (local_168.obj_ != (Trap *)0x0) {
          operator_delete(local_168.obj_);
        }
        if (RVar18.enum_ == Error) {
          local_1b0->obj_ = (Instance *)0x0;
          local_1b0->store_ = (Store *)0x0;
          local_1b0->root_index_ = 0;
          if ((Memory *)local_1e8._M_unused._0_8_ != (Memory *)0x0) {
            operator_delete(local_1e8._M_unused._M_object);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208.i64_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            FreeList<wabt::interp::Ref>::Delete
                      ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                       local_1f8._M_allocated_capacity);
            local_208.i64_ = 0;
            local_208._8_8_ = 0;
            local_1f8._M_allocated_capacity = 0;
          }
          goto LAB_001a069f;
        }
        if ((Memory *)local_1e8._M_unused._0_8_ != (Memory *)0x0) {
          operator_delete(local_1e8._M_unused._M_object);
        }
        out_trap_00 = local_170;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208.i64_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          FreeList<wabt::interp::Ref>::Delete
                    ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                     local_1f8._M_allocated_capacity);
          local_208.i64_ = 0;
          local_208._8_8_ = 0;
          local_1f8._M_allocated_capacity = 0;
        }
        pSVar34 = pSVar34 + 1;
      } while (pSVar34 != pSVar15);
    }
    local_1b0->obj_ = local_1c8.obj_;
    local_1b0->store_ = local_1c8.store_;
    local_1b0->root_index_ = local_1c8.root_index_;
    local_1c8.obj_ = (Instance *)0x0;
    local_1c8.store_ = (Store *)0x0;
    local_1c8.root_index_ = 0;
  }
LAB_001a069f:
  if (local_1c8.obj_ != (Instance *)0x0) {
    FreeList<wabt::interp::Ref>::Delete(&(local_1c8.store_)->roots_,local_1c8.root_index_);
    local_1c8.obj_ = (Instance *)0x0;
    local_1c8.store_ = (Store *)0x0;
    local_1c8.root_index_ = 0;
  }
  if (local_1a8.obj_ != (Module *)0x0) {
    FreeList<wabt::interp::Ref>::Delete(&(local_1a8.store_)->roots_,local_1a8.root_index_);
  }
  return local_1b0;
}

Assistant:

Instance::Ptr Instance::Instantiate(Store& store,
                                    Ref module,
                                    const RefVec& imports,
                                    Trap::Ptr* out_trap) {
  Module::Ptr mod{store, module};
  Instance::Ptr inst = store.Alloc<Instance>(store, module);

  size_t import_desc_count = mod->desc().imports.size();
  if (imports.size() < import_desc_count) {
    *out_trap = Trap::New(store, "not enough imports!");
    return {};
  }

  // Imports.
  for (size_t i = 0; i < import_desc_count; ++i) {
    auto&& import_desc = mod->desc().imports[i];
    Ref extern_ref = imports[i];
    if (extern_ref == Ref::Null) {
      *out_trap = Trap::New(store, StringPrintf("invalid import \"%s.%s\"",
                                                import_desc.type.module.c_str(),
                                                import_desc.type.name.c_str()));
      return {};
    }

    Extern::Ptr extern_{store, extern_ref};
    if (Failed(extern_->Match(store, import_desc.type, out_trap))) {
      return {};
    }

    inst->imports_.push_back(extern_ref);

    switch (import_desc.type.type->kind) {
      case ExternKind::Func:   inst->funcs_.push_back(extern_ref); break;
      case ExternKind::Table:  inst->tables_.push_back(extern_ref); break;
      case ExternKind::Memory: inst->memories_.push_back(extern_ref); break;
      case ExternKind::Global: inst->globals_.push_back(extern_ref); break;
      case ExternKind::Event:  inst->events_.push_back(extern_ref); break;
    }
  }

  // Funcs.
  for (auto&& desc : mod->desc().funcs) {
    inst->funcs_.push_back(DefinedFunc::New(store, inst.ref(), desc).ref());
  }

  // Tables.
  for (auto&& desc : mod->desc().tables) {
    inst->tables_.push_back(Table::New(store, desc.type).ref());
  }

  // Memories.
  for (auto&& desc : mod->desc().memories) {
    inst->memories_.push_back(Memory::New(store, desc.type).ref());
  }

  // Globals.
  for (auto&& desc : mod->desc().globals) {
    inst->globals_.push_back(
        Global::New(store, desc.type, inst->ResolveInitExpr(store, desc.init))
            .ref());
  }

  // Events.
  for (auto&& desc : mod->desc().events) {
    inst->events_.push_back(Event::New(store, desc.type).ref());
  }

  // Exports.
  for (auto&& desc : mod->desc().exports){
    Ref ref;
    switch (desc.type.type->kind) {
      case ExternKind::Func:   ref = inst->funcs_[desc.index]; break;
      case ExternKind::Table:  ref = inst->tables_[desc.index]; break;
      case ExternKind::Memory: ref = inst->memories_[desc.index]; break;
      case ExternKind::Global: ref = inst->globals_[desc.index]; break;
      case ExternKind::Event:  ref = inst->events_[desc.index]; break;
    }
    inst->exports_.push_back(ref);
  }

  // Elems.
  for (auto&& desc : mod->desc().elems) {
    inst->elems_.emplace_back(&desc, inst);
  }

  // Datas.
  for (auto&& desc : mod->desc().datas) {
    inst->datas_.emplace_back(&desc);
  }

  // Initialization.
  enum Pass { Check, Init };
  int pass = store.features().bulk_memory_enabled() ? Init : Check;
  for (; pass <= Init; ++pass) {
    // Elems.
    for (auto&& segment : inst->elems_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Table::Ptr table{store, inst->tables_[desc.table_index]};
        u32 offset = inst->ResolveInitExpr(store, desc.offset).Get<u32>();
        if (pass == Check) {
          result = table->IsValidRange(offset, segment.size()) ? Result::Ok
                                                               : Result::Error;
        } else {
          result = table->Init(store, offset, segment, 0, segment.size());
          segment.Drop();
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store, StringPrintf(
                         "out of bounds table access: elem segment is "
                         "out of bounds: [%u, %" PRIu64 ") >= max value %u",
                         offset, u64{offset} + segment.size(), table->size()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }

    // Data.
    for (auto&& segment : inst->datas_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Memory::Ptr memory{store, inst->memories_[desc.memory_index]};
        u32 offset = inst->ResolveInitExpr(store, desc.offset).Get<u32>();
        if (pass == Check) {
          result = memory->IsValidAccess(offset, 0, segment.size())
                       ? Result::Ok
                       : Result::Error;
        } else {
          result = memory->Init(offset, segment, 0, segment.size());
          segment.Drop();
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store,
              StringPrintf("out of bounds memory access: data segment is "
                           "out of bounds: [%u, %" PRIu64 ") >= max value %"
                           PRIu64, offset, u64{offset} + segment.size(),
                           memory->ByteSize()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }
  }

  // Start.
  for (auto&& start : mod->desc().starts) {
    Func::Ptr func{store, inst->funcs_[start.func_index]};
    Values results;
    if (Failed(func->Call(store, {}, results, out_trap))) {
      return {};
    }
  }

  return inst;
}